

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_nl.h
# Opt level: O1

void __thiscall
mp::NLConstraint::NLConstraint(NLConstraint *this,LinTerms *lt,int expr,AlgConRange rng,bool fSort)

{
  undefined1 local_a0 [72];
  ptr local_58;
  ulong local_50;
  
  (this->super_BasicConstraint).name_._M_dataplus._M_p =
       (pointer)&(this->super_BasicConstraint).name_.field_2;
  (this->super_BasicConstraint).name_._M_string_length = 0;
  (this->super_BasicConstraint).name_.field_2._M_local_buf[0] = '\0';
  gch::detail::small_vector_base<std::allocator<double>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<double>,6u> *)local_a0);
  gch::detail::small_vector_base<std::allocator<int>,6u>::small_vector_base<6u>
            ((small_vector_base<std::allocator<int>,6u> *)&local_58,&lt->vars_);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRange>::AlgebraicConstraint
            (&this->lcr_,(LinTerms *)local_a0,rng,fSort);
  if (6 < local_50) {
    operator_delete(local_58,local_50 << 2);
  }
  if (6 < (ulong)local_a0._8_8_) {
    operator_delete((void *)local_a0._0_8_,local_a0._8_8_ << 3);
  }
  this->expr_ = expr;
  return;
}

Assistant:

NLConstraint(
      const LinTerms& lt, int expr, AlgConRange rng,
      bool fSort=true)
      : lcr_(lt, rng, fSort), expr_(expr) { }